

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utIOStreamBuffer.cpp
# Opt level: O2

void __thiscall
IOStreamBufferTest_creationTest_Test::TestBody(IOStreamBufferTest_creationTest_Test *this)

{
  AssertionResult gtest_ar_;
  IOStreamBuffer<char> myBuffer;
  
  Assimp::IOStreamBuffer<char>::IOStreamBuffer(&myBuffer,0x1000000);
  std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base
            (&myBuffer.m_cache.super__Vector_base<char,_std::allocator<char>_>);
  gtest_ar_.success_ = true;
  gtest_ar_.message_.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
  ;
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_.message_);
  return;
}

Assistant:

TEST_F( IOStreamBufferTest, creationTest ) {
    bool ok( true );
    try {
        IOStreamBuffer<char> myBuffer;
    } catch ( ... ) {
        ok = false;
    }
    EXPECT_TRUE( ok );
}